

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O1

int FinalizeSkipProba(VP8Encoder *enc)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar4 = (long)enc->mb_h_ * (long)enc->mb_w_;
  iVar1 = (enc->proba_).nb_skip_;
  if ((int)uVar4 == 0) {
    uVar2 = 0xff;
  }
  else {
    uVar2 = (uint)(((uVar4 - (long)iVar1) * 0xff) / uVar4);
  }
  (enc->proba_).skip_proba_ = (byte)uVar2;
  iVar3 = 0x100;
  bVar5 = (uVar2 & 0xfe) < 0xfa;
  (enc->proba_).use_skip_proba_ = (uint)bVar5;
  if (bVar5) {
    iVar3 = (uint)VP8EntropyCost[(byte)~(byte)uVar2] * iVar1 +
            (uint)VP8EntropyCost[uVar2 & 0xff] * ((int)uVar4 - iVar1) + 0x900;
  }
  return iVar3;
}

Assistant:

static int FinalizeSkipProba(VP8Encoder* const enc) {
  VP8EncProba* const proba = &enc->proba_;
  const int nb_mbs = enc->mb_w_ * enc->mb_h_;
  const int nb_events = proba->nb_skip_;
  int size;
  proba->skip_proba_ = CalcSkipProba(nb_events, nb_mbs);
  proba->use_skip_proba_ = (proba->skip_proba_ < SKIP_PROBA_THRESHOLD);
  size = 256;   // 'use_skip_proba' bit
  if (proba->use_skip_proba_) {
    size +=  nb_events * VP8BitCost(1, proba->skip_proba_)
         + (nb_mbs - nb_events) * VP8BitCost(0, proba->skip_proba_);
    size += 8 * 256;   // cost of signaling the skip_proba_ itself.
  }
  return size;
}